

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

int get_start_shift_convolve(int width,int filt_width,int stride)

{
  int local_24;
  int local_1c;
  int dif;
  int filt_off;
  int mod;
  int stride_local;
  int filt_width_local;
  int width_local;
  
  local_24 = (filt_width + -1) / 2;
  if (width % stride == 0) {
    local_1c = stride + -1;
  }
  else {
    local_1c = width % stride + -1;
  }
  if ((local_1c + filt_width % 2) / 2 < local_24) {
    local_24 = (local_1c + filt_width % 2) / 2;
  }
  return local_24;
}

Assistant:

static inline int get_start_shift_convolve(int width, int filt_width,
                                           int stride) {
  const int mod = (width % stride);
  const int filt_off = (filt_width - 1) / 2;
  const int dif = (mod ? mod - 1 : stride - 1);
  return AOMMIN((dif + (filt_width % 2)) / 2, filt_off);
}